

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O0

ostream * amrex::operator<<(ostream *os,Array<unsigned_int,_3> *a)

{
  ostream *poVar1;
  const_reference pvVar2;
  ostream *poVar3;
  ostream *poVar4;
  ostream *in_RDI;
  array<unsigned_int,_3UL> *in_stack_ffffffffffffffe0;
  
  poVar1 = std::operator<<(in_RDI,'(');
  pvVar2 = std::array<unsigned_int,_3UL>::operator[](in_stack_ffffffffffffffe0,(size_type)poVar1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar3 = std::operator<<(poVar3,',');
  pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)poVar3,(size_type)poVar1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar4 = std::operator<<(poVar4,',');
  pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)poVar3,(size_type)poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar4,*pvVar2);
  std::operator<<(poVar1,')');
  return in_RDI;
}

Assistant:

std::ostream& operator<< (std::ostream& os, Array<T,AMREX_SPACEDIM> const& a)
    {
        os << AMREX_D_TERM( '(' << a[0] , <<
                            ',' << a[1] , <<
                            ',' << a[2])  << ')';
        return os;
    }